

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

FlatView * generate_memory_topology(uc_struct_conflict15 *uc,MemoryRegion_conflict *mr)

{
  long *plVar1;
  FlatRange *pFVar2;
  ulong uVar3;
  ulong uVar4;
  AddrRange clip;
  Int128 IVar5;
  FlatView *view;
  AddressSpaceDispatch *pAVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  FlatRange *pFVar10;
  Int128 *pIVar11;
  uint uVar12;
  FlatRange *pFVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  undefined8 in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  MemoryRegionSection mrs;
  
  view = (FlatView *)g_malloc0(0x28);
  view->ref = 1;
  view->root = (MemoryRegion *)mr;
  if (mr != (MemoryRegion_conflict *)0x0) {
    clip.size._0_8_ = in_stack_ffffffffffffff58;
    clip.start = (Int128)(ZEXT816(1) << 0x40);
    clip.size._8_8_ = in_stack_ffffffffffffff60;
    render_memory_region(view,mr,(Int128)ZEXT816(0),clip,false);
  }
  uVar7 = view->nr;
  uVar8 = 1;
  uVar9 = 0;
  do {
    if (uVar7 <= uVar9) {
      pAVar6 = address_space_dispatch_new_tricore(uc,view);
      view->dispatch = pAVar6;
      lVar16 = 0;
      for (uVar9 = 0; uVar9 < view->nr; uVar9 = uVar9 + 1) {
        section_from_flat_range(&mrs,(FlatRange *)((long)&view->ranges->mr + lVar16),view);
        flatview_add_to_dispatch_tricore(uc,view,&mrs);
        lVar16 = lVar16 + 0x40;
      }
      address_space_dispatch_compact_tricore(view->dispatch);
      g_hash_table_replace(uc->flat_views,mr,view);
      return view;
    }
    uVar15 = (ulong)uVar8;
    uVar14 = uVar9 + 1;
    pFVar2 = view->ranges;
    pIVar11 = &pFVar2[uVar9].addr.size;
    pFVar10 = pFVar2 + uVar15;
    for (; uVar15 < uVar7; uVar15 = uVar15 + 1) {
      uVar12 = (int)uVar15 - 1;
      uVar3 = (ulong)pFVar2[uVar12].addr.size;
      lVar16 = *(long *)((long)&pFVar2[uVar12].addr.size + 8);
      uVar4 = (ulong)pFVar2[uVar12].addr.start;
      if ((((uVar4 + uVar3 != (long)(pFVar10->addr).start ||
             *(long *)((long)&pFVar2[uVar12].addr.start + 8) + lVar16 + (ulong)CARRY8(uVar4,uVar3)
             != *(long *)((long)&(pFVar10->addr).start + 8)) ||
           (pFVar13 = pFVar2 + uVar12, pFVar13->mr != pFVar10->mr)) ||
          (uVar3 + pFVar13->offset_in_region != pFVar10->offset_in_region ||
           lVar16 + (ulong)CARRY8(uVar3,pFVar13->offset_in_region) != 0)) ||
         (pFVar13->readonly != pFVar10->readonly)) goto LAB_00b131ed;
      uVar3 = (ulong)(pFVar10->addr).size;
      lVar16 = *(long *)((long)&(pFVar10->addr).size + 8);
      IVar5 = *pIVar11;
      *(ulong *)pIVar11 = (long)*pIVar11 + uVar3;
      plVar1 = (long *)((long)&pFVar2[uVar9].addr.size + 8);
      *plVar1 = *plVar1 + lVar16 + (ulong)CARRY8((ulong)IVar5,uVar3);
      pFVar10 = pFVar10 + 1;
    }
    uVar15 = (ulong)uVar7;
LAB_00b131ed:
    memmove(pFVar2 + uVar14,pFVar2 + (uVar15 & 0xffffffff),(ulong)(uVar7 - (int)uVar15) << 6);
    uVar7 = ((int)uVar14 - (int)uVar15) + view->nr;
    view->nr = uVar7;
    uVar8 = uVar8 + 1;
    uVar9 = uVar14;
  } while( true );
}

Assistant:

static FlatView *generate_memory_topology(struct uc_struct *uc, MemoryRegion *mr)
{
    int i;
    FlatView *view;

    view = flatview_new(mr);

    if (mr) {
        render_memory_region(view, mr, int128_zero(),
                             addrrange_make(int128_zero(), int128_2_64()),
                             false);
    }
    flatview_simplify(view);

    view->dispatch = address_space_dispatch_new(uc, view);
    for (i = 0; i < view->nr; i++) {
        MemoryRegionSection mrs =
            section_from_flat_range(&view->ranges[i], view);
        flatview_add_to_dispatch(uc, view, &mrs);
    }
    address_space_dispatch_compact(view->dispatch);
    g_hash_table_replace(uc->flat_views, mr, view);

    return view;
}